

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_0::AsyncStreamFd::write(AsyncStreamFd *this,int __fd,void *__buf,size_t __n)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  AsyncStreamFd *pAVar3;
  int iVar4;
  ssize_t sVar5;
  void *pvVar6;
  int iVar7;
  undefined4 in_register_00000034;
  PromiseArena *pPVar8;
  TransformPromiseNodeBase *this_00;
  Fault f;
  OwnPromiseNode local_68;
  AsyncStreamFd *local_60;
  OwnPromiseNode local_58;
  AsyncInputStream local_50;
  undefined1 local_48 [24];
  
  pPVar8 = (PromiseArena *)CONCAT44(in_register_00000034,__fd);
  iVar7 = 0;
  local_60 = this;
  do {
    sVar5 = ::write(*(int *)(pPVar8->bytes + 0x10),__buf,__n);
    if (-1 < sVar5) {
      iVar4 = 0;
      break;
    }
    iVar4 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_50._vptr_AsyncInputStream = (_func_int **)0x0;
    local_48._0_8_ = (Disposer *)0x0;
    local_48._8_8_ = (PromiseFulfiller<void> *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_50,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
              );
    kj::_::Debug::Fault::~Fault((Fault *)&local_50);
    iVar7 = 5;
  }
  pAVar3 = local_60;
  if (iVar7 == 0) {
    if (sVar5 < 0) {
      UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)&local_68);
      OVar2.ptr = local_68.ptr;
      pPVar1 = (PromiseArena *)
               ((SleepHooks *)&((local_68.ptr)->super_PromiseArenaMember).arena)->_vptr_SleepHooks;
      if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_68.ptr - (long)pPVar1) < 0x38) {
        pvVar6 = operator_new(0x400);
        this_00 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3c8);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,&local_68,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:202:50)>
                   ::anon_class_24_2_4f696100_for_func::operator());
        *(undefined ***)((long)pvVar6 + 0x3c8) = &PTR_destroy_0070deb0;
        *(void **)((long)pvVar6 + 1000) = __buf;
        *(size_t *)((long)pvVar6 + 0x3f0) = __n;
        *(PromiseArena **)((long)pvVar6 + 0x3f8) = pPVar8;
        *(void **)((long)pvVar6 + 0x3d0) = pvVar6;
      }
      else {
        ((SleepHooks *)&((local_68.ptr)->super_PromiseArenaMember).arena)->_vptr_SleepHooks =
             (_func_int **)0x0;
        this_00 = (TransformPromiseNodeBase *)&local_68.ptr[-4].super_PromiseArenaMember.arena;
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (this_00,&local_68,
                   kj::_::
                   SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:202:50)>
                   ::anon_class_24_2_4f696100_for_func::operator());
        OVar2.ptr[-4].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0070deb0;
        OVar2.ptr[-2].super_PromiseArenaMember.arena = (PromiseArena *)__buf;
        OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)__n;
        OVar2.ptr[-1].super_PromiseArenaMember.arena = pPVar8;
        OVar2.ptr[-3].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
      }
      local_48._0_8_ = &DAT_005053bd;
      local_48._8_8_ = &DAT_0050541c;
      local_48._16_8_ = (Disposer *)0x4c0000058b;
      local_58.ptr = &this_00->super_PromiseNode;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                ((PromiseDisposer *)&local_50,&local_58,(SourceLocation *)local_48);
      OVar2.ptr = local_58.ptr;
      pAVar3 = local_60;
      (local_60->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = local_50._vptr_AsyncInputStream;
      if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
        local_58.ptr = (PromiseNode *)0x0;
        kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      }
      OVar2.ptr = local_68.ptr;
      if ((UnixEventPort *)local_68.ptr == (UnixEventPort *)0x0) {
        return (ssize_t)pAVar3;
      }
      local_68.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
      return (ssize_t)pAVar3;
    }
    if (__n - sVar5 != 0) {
      (**(code **)(*(long *)pPVar8->bytes + 0xa0))(local_60,pPVar8,(long)__buf + sVar5,__n - sVar5);
      return (ssize_t)pAVar3;
    }
    kj::_::readyNow();
  }
  else {
    if (iVar7 != 5) {
      return (ssize_t)local_60;
    }
    kj::_::readyNow();
    local_60 = pAVar3;
  }
  (local_60->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)local_48._0_8_;
  return (ssize_t)local_60;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = ::write(fd, buffer.begin(), buffer.size())) {
      // Error.

      // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
      // a bug that exists in both Clang and GCC:
      //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
      //   http://llvm.org/bugs/show_bug.cgi?id=12286
      goto error;
    }
    if (false) {
    error:
      return kj::READY_NOW;
    }

    if (n < 0) {
      // EAGAIN -- need to wait for writability and try again.
      return observer.whenBecomesWritable().then([buffer, this]() {
        return write(buffer);
      });
    } else if (n == buffer.size()) {
      // All done.
      return READY_NOW;
    } else {
      // Fewer than `size` bytes were written, but we CANNOT assume we're out of buffer space, as
      // Linux is known to return partial reads/writes when interrupted by a signal -- yes, even
      // for non-blocking operations. So, we'll need to write() again now, even though it will
      // almost certainly fail with EAGAIN. See comments in the read path for more info.
      buffer = buffer.slice(n);
      return write(buffer);
    }
  }